

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O1

bool __thiscall
dg::legacy::DataFlowAnalysis<dg::LLVMNode>::runOnBlock
          (DataFlowAnalysis<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *B)

{
  _List_node_base *p_Var1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  byte bVar5;
  
  p_Var4 = (B->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 == (_List_node_base *)&B->nodes) {
    bVar5 = 0;
  }
  else {
    bVar5 = 0;
    p_Var3 = (_List_node_base *)0x0;
    do {
      p_Var1 = p_Var4[1]._M_next;
      iVar2 = (*(this->super_BBlockDataFlowAnalysis<dg::LLVMNode>)._vptr_BBlockDataFlowAnalysis[1])
                        (this,p_Var1,p_Var3);
      bVar5 = bVar5 | (byte)iVar2;
      p_Var4 = p_Var4->_M_next;
      p_Var3 = p_Var1;
    } while (p_Var4 != (_List_node_base *)&B->nodes);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool runOnBlock(BBlock<NodeT> *B) override {
        bool changed = false;
        NodeT *prev = nullptr;

        for (NodeT *n : B->getNodes()) {
            changed |= runOnNode(n, prev);
            prev = n;
        }

        return changed;
    }